

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall
QRenderRule::configurePalette(QRenderRule *this,QPalette *p,ColorGroup cg,QWidget *w,bool embedded)

{
  QSharedDataPointer<QStyleSheetBackgroundData> *this_00;
  QStyleSheetBackgroundData *pQVar1;
  QStyleSheetBorderData *pQVar2;
  QStyleSheetPaletteData *pQVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  ColorRole CVar7;
  ColorGroup CVar8;
  QSharedDataPointer<QStyleSheetPaletteData> *this_01;
  long in_FS_OFFSET;
  QBrush placeholder;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->bg;
  pQVar1 = (this->bg).d.ptr;
  if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
     ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1)) {
    QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
  }
  pQVar1 = (this_00->d).ptr;
  CVar8 = (ColorGroup)p;
  if (pQVar1 != (QStyleSheetBackgroundData *)0x0) {
    if ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
    }
    pQVar1 = (this_00->d).ptr;
    if (*(int *)(*(long *)&pQVar1->brush + 4) != 0) {
      if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      }
      QPalette::setBrush(CVar8,cg,(QBrush *)0x9);
      pQVar1 = (this_00->d).ptr;
      if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      }
      QPalette::setBrush(CVar8,cg,(QBrush *)0x1);
      CVar7 = QWidget::backgroundRole(w);
      pQVar1 = (this_00->d).ptr;
      if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      }
      QPalette::setBrush(CVar8,cg,(QBrush *)(ulong)CVar7);
      pQVar1 = (this_00->d).ptr;
      if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      }
      QPalette::setBrush(CVar8,cg,(QBrush *)&DAT_0000000a);
    }
  }
  if (!embedded) goto LAB_0035881a;
  if ((this_00->d).ptr == (QStyleSheetBackgroundData *)0x0) {
LAB_003587be:
    pQVar2 = (this->bd).d.ptr;
    if ((pQVar2 == (QStyleSheetBorderData *)0x0) ||
       ((pQVar2->bi).d.ptr == (QStyleSheetBorderImageData *)0x0)) goto LAB_0035881a;
    cVar5 = QPixmap::isNull();
    if (cVar5 != '\0') goto LAB_0035881a;
  }
  else {
    cVar5 = QPixmap::isNull();
    if ((cVar5 != '\0') && (*(int *)(*(long *)&((this_00->d).ptr)->brush + 4) == 0))
    goto LAB_003587be;
    bVar6 = QStyleSheetBackgroundData::isTransparent((this_00->d).ptr);
    if (!bVar6) goto LAB_003587be;
  }
  CVar7 = QWidget::backgroundRole(w);
  QBrush::QBrush((QBrush *)&local_48,NoBrush);
  QPalette::setBrush(CVar8,cg,(QBrush *)(ulong)CVar7);
  QBrush::~QBrush((QBrush *)&local_48);
LAB_0035881a:
  pQVar3 = (this->pal).d.ptr;
  if (pQVar3 != (QStyleSheetPaletteData *)0x0) {
    this_01 = &this->pal;
    if ((__int_type)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
    }
    pQVar3 = (this_01->d).ptr;
    if (*(int *)(*(long *)&pQVar3->foreground + 4) != 0) {
      if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      setDefault(p,cg,ButtonText,&((this_01->d).ptr)->foreground,w);
      CVar7 = QWidget::foregroundRole(w);
      pQVar3 = (this_01->d).ptr;
      if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      setDefault(p,cg,CVar7,&((this_01->d).ptr)->foreground,w);
      pQVar3 = (this_01->d).ptr;
      if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      setDefault(p,cg,WindowText,&((this_01->d).ptr)->foreground,w);
      pQVar3 = (this_01->d).ptr;
      if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      setDefault(p,cg,Text,&((this_01->d).ptr)->foreground,w);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = (this_01->d).ptr;
      if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      lVar4 = *(long *)&((this_01->d).ptr)->foreground;
      local_48 = *(undefined1 **)(lVar4 + 8);
      puStack_40 = *(undefined1 **)(lVar4 + 0x10);
      QColor::alpha();
      QColor::setAlpha((int)&local_48);
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = (this_01->d).ptr;
      if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QBrush::QBrush((QBrush *)&local_50,&((this_01->d).ptr)->foreground);
      QBrush::setColor((QColor *)&local_50);
      setDefault(p,cg,PlaceholderText,(QBrush *)&local_50,w);
      QBrush::~QBrush((QBrush *)&local_50);
    }
    pQVar3 = (this_01->d).ptr;
    if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
       ((__int_type)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
    }
    pQVar3 = (this_01->d).ptr;
    if (*(int *)(*(long *)&pQVar3->selectionBackground + 4) != 0) {
      if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar8,cg,(QBrush *)0xc);
    }
    pQVar3 = (this_01->d).ptr;
    if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
       ((__int_type)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
    }
    pQVar3 = (this_01->d).ptr;
    if (*(int *)(*(long *)&pQVar3->selectionForeground + 4) != 0) {
      if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar8,cg,(QBrush *)0xd);
    }
    pQVar3 = (this_01->d).ptr;
    if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
       ((__int_type)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
    }
    pQVar3 = (this_01->d).ptr;
    if (*(int *)(*(long *)&pQVar3->alternateBackground + 4) != 0) {
      if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar8,cg,(QBrush *)0x10);
    }
    pQVar3 = (this_01->d).ptr;
    if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
       ((__int_type)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
    }
    pQVar3 = (this_01->d).ptr;
    if (*(int *)(*(long *)&pQVar3->placeholderForeground + 4) != 0) {
      if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar8,cg,(QBrush *)0x14);
    }
    pQVar3 = (this_01->d).ptr;
    if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
       ((__int_type)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
    }
    pQVar3 = (this_01->d).ptr;
    if (*(int *)(*(long *)&pQVar3->accent + 4) != 0) {
      if ((pQVar3 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar8,cg,(QBrush *)0x15);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::configurePalette(QPalette *p, QPalette::ColorGroup cg, const QWidget *w, bool embedded)
{
    if (bg && bg->brush.style() != Qt::NoBrush) {
        p->setBrush(cg, QPalette::Base, bg->brush); // for windows, windowxp
        p->setBrush(cg, QPalette::Button, bg->brush); // for plastique
        p->setBrush(cg, w->backgroundRole(), bg->brush);
        p->setBrush(cg, QPalette::Window, bg->brush);
    }

    if (embedded) {
        /* For embedded widgets (ComboBox, SpinBox and ScrollArea) we want the embedded widget
         * to be transparent when we have a transparent background or border image */
        if ((hasBackground() && background()->isTransparent())
            || (hasBorder() && border()->hasBorderImage() && !border()->borderImage()->pixmap.isNull()))
            p->setBrush(cg, w->backgroundRole(), Qt::NoBrush);
    }

    if (!hasPalette())
        return;

    if (pal->foreground.style() != Qt::NoBrush) {
        setDefault(p, cg, QPalette::ButtonText, pal->foreground, w);
        setDefault(p, cg, w->foregroundRole(), pal->foreground, w);
        setDefault(p, cg, QPalette::WindowText, pal->foreground, w);
        setDefault(p, cg, QPalette::Text, pal->foreground, w);
        QColor phColor(pal->foreground.color());
        phColor.setAlpha((phColor.alpha() + 1) / 2);
        QBrush placeholder = pal->foreground;
        placeholder.setColor(phColor);
        setDefault(p, cg, QPalette::PlaceholderText, placeholder, w);
    }
    if (pal->selectionBackground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::Highlight, pal->selectionBackground);
    if (pal->selectionForeground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::HighlightedText, pal->selectionForeground);
    if (pal->alternateBackground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::AlternateBase, pal->alternateBackground);
    if (pal->placeholderForeground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::PlaceholderText, pal->placeholderForeground);
    if (pal->accent.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::Accent, pal->accent);
}